

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O2

void __thiscall QTableWidget::setVerticalHeaderLabels(QTableWidget *this,QStringList *labels)

{
  int iVar1;
  QTableModel *this_00;
  QTableWidgetItem *item;
  long lVar2;
  int i;
  ulong uVar3;
  long in_FS_OFFSET;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = QTableWidgetPrivate::tableModel
                      (*(QTableWidgetPrivate **)
                        &(this->super_QTableView).super_QAbstractItemView.super_QAbstractScrollArea.
                         super_QFrame.super_QWidget.field_0x8);
  lVar2 = 0;
  uVar3 = 0;
  while( true ) {
    local_50 = 0xffffffffffffffff;
    local_48 = 0;
    uStack_40 = 0;
    iVar1 = (**(code **)(*(long *)this_00 + 0x78))(this_00,&local_50);
    if (((long)iVar1 <= (long)uVar3) || ((ulong)(labels->d).size <= uVar3)) break;
    if (((ulong)(this_00->verticalHeaderItems).d.size <= uVar3) ||
       (item = (this_00->verticalHeaderItems).d.ptr[uVar3], item == (QTableWidgetItem *)0x0)) {
      item = QTableModel::createItem(this_00);
      setVerticalHeaderItem(this,(int)uVar3,item);
    }
    QTableWidgetItem::setText(item,(QString *)((long)&(((labels->d).ptr)->d).d + lVar2));
    uVar3 = uVar3 + 1;
    lVar2 = lVar2 + 0x18;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTableWidget::setVerticalHeaderLabels(const QStringList &labels)
{
    Q_D(QTableWidget);
    QTableModel *model = d->tableModel();
    QTableWidgetItem *item = nullptr;
    for (int i = 0; i < model->rowCount() && i < labels.size(); ++i) {
        item = model->verticalHeaderItem(i);
        if (!item) {
            item = model->createItem();
            setVerticalHeaderItem(i, item);
        }
        item->setText(labels.at(i));
    }
}